

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

void anon_unknown.dwarf_2c92::ndiTXHelper(ndicapi *pol,char *command,char *commandReply)

{
  char cVar1;
  int iVar2;
  unsigned_long uVar3;
  long lVar4;
  unsigned_long uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  char *pcVar10;
  uint uVar11;
  unsigned_long uVar12;
  int iVar13;
  
  uVar12 = 1;
  if (command[2] == ' ') {
    cVar1 = command[3];
  }
  else {
    if (command[2] != ':') goto LAB_00107cb0;
    cVar1 = command[7];
  }
  if (cVar1 != '\r') {
    uVar12 = ndiHexToUnsignedLong(command + 3,4);
  }
LAB_00107cb0:
  uVar3 = ndiHexToUnsignedLong(commandReply,2);
  iVar13 = (int)uVar3;
  pcVar10 = commandReply + 2;
  lVar4 = 0;
  do {
    if (commandReply[lVar4] < ' ') {
      pcVar10 = commandReply + lVar4;
      break;
    }
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 == 1);
  if (0 < iVar13) {
    iVar2 = 0;
    do {
      uVar5 = ndiHexToUnsignedLong(pcVar10,2);
      pcVar8 = pcVar10 + 2;
      lVar4 = 0;
      do {
        if (pcVar10[lVar4] < ' ') {
          pcVar8 = pcVar10 + lVar4;
          break;
        }
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 == 1);
      if (*pcVar8 == 'U') {
        pcVar10 = pcVar8 + 10;
        lVar4 = 0;
        do {
          if (pcVar8[lVar4] < ' ') {
            pcVar10 = pcVar8 + lVar4;
            break;
          }
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 != 10);
        uVar3 = (unsigned_long)((int)uVar3 - 1);
      }
      else {
        pol->TxHandles[iVar2] = (uchar)uVar5;
        if ((uVar12 & 1) != 0) {
          if (*pcVar8 == 'M') {
            lVar4 = 0;
            do {
              if (pcVar8[lVar4] < ' ') break;
              pol->TxTransforms[iVar2][lVar4] = pcVar8[lVar4];
              lVar4 = lVar4 + 1;
            } while ((int)lVar4 != 7);
          }
          else if (*pcVar8 == 'D') {
            lVar4 = 0;
            do {
              if (pcVar8[lVar4] < ' ') break;
              pol->TxTransforms[iVar2][lVar4] = pcVar8[lVar4];
              lVar4 = lVar4 + 1;
            } while ((int)lVar4 != 8);
          }
          else {
            lVar4 = 0;
            do {
              if (pcVar8[lVar4] < ' ') break;
              pol->TxTransforms[iVar2][lVar4] = pcVar8[lVar4];
              lVar4 = lVar4 + 1;
            } while ((int)lVar4 != 0x33);
          }
          pol->TxTransforms[iVar2][lVar4] = '\0';
          lVar6 = 0;
          do {
            if (pcVar8[lVar6 + lVar4] < ' ') break;
            pol->TxStatus[iVar2][lVar6] = pcVar8[lVar6 + lVar4];
            lVar6 = lVar6 + 1;
          } while ((int)lVar6 != 8);
          lVar7 = 0;
          do {
            if (pcVar8[lVar7 + lVar6 + lVar4] < ' ') break;
            pol->TxFrame[iVar2][lVar7] = pcVar8[lVar7 + lVar6 + lVar4];
            lVar7 = lVar7 + 1;
          } while ((int)lVar7 != 8);
          pcVar8 = pcVar8 + lVar7 + lVar6 + lVar4;
        }
        if ((uVar12 & 2) != 0) {
          lVar4 = 0;
          do {
            if (pcVar8[lVar4] < ' ') break;
            pol->TxInformation[iVar2][lVar4] = pcVar8[lVar4];
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x14);
          pcVar8 = pcVar8 + lVar4;
        }
        if ((uVar12 & 4) != 0) {
          if (*pcVar8 == 'M') {
            lVar4 = 0;
            do {
              if (pcVar8[lVar4] < ' ') break;
              pol->TxSingleStray[iVar2][lVar4] = pcVar8[lVar4];
              lVar4 = lVar4 + 1;
            } while ((int)lVar4 != 7);
          }
          else if (*pcVar8 == 'D') {
            lVar4 = 0;
            do {
              if (pcVar8[lVar4] < ' ') break;
              pol->TxSingleStray[iVar2][lVar4] = pcVar8[lVar4];
              lVar4 = lVar4 + 1;
            } while ((int)lVar4 != 8);
          }
          else {
            lVar4 = 0;
            do {
              if (pcVar8[lVar4] < ' ') break;
              pol->TxSingleStray[iVar2][lVar4] = pcVar8[lVar4];
              lVar4 = lVar4 + 1;
            } while ((int)lVar4 != 0x15);
          }
          pcVar8 = pcVar8 + lVar4;
          pol->TxSingleStray[iVar2][lVar4] = '\0';
        }
        pcVar8 = pcVar8 + -1;
        do {
          pcVar10 = pcVar8 + 1;
          pcVar8 = pcVar8 + 1;
        } while ('\x1f' < *pcVar10);
        pcVar10 = pcVar8 + (*pcVar10 == '\n');
        iVar2 = iVar2 + 1;
      }
      iVar13 = (int)uVar3;
    } while (iVar2 < iVar13);
  }
  pol->TxHandleCount = iVar13;
  pcVar8 = pcVar10;
  if (((uint)uVar12 >> 0xc & 1) != 0) {
    uVar12 = ndiHexToUnsignedLong(pcVar10,2);
    pcVar8 = pcVar10 + 2;
    lVar4 = 0;
    do {
      if (pcVar10[lVar4] < ' ') {
        pcVar8 = pcVar10 + lVar4;
        break;
      }
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 == 1);
    iVar2 = (int)uVar12;
    iVar13 = 0x32;
    if (iVar2 < 0x32) {
      iVar13 = iVar2;
    }
    pol->TxPassiveStrayCount = iVar13;
    if (0 < iVar2) {
      uVar9 = iVar13 + 3U >> 2;
      uVar11 = 1;
      if (1 < uVar9) {
        uVar11 = uVar9;
      }
      lVar4 = 0;
      do {
        if (pcVar8[lVar4] < ' ') break;
        pol->TxPassiveStrayOov[lVar4] = pcVar8[lVar4];
        lVar4 = lVar4 + 1;
      } while (uVar11 != (uint)lVar4);
      pcVar8 = pcVar8 + lVar4;
    }
    pcVar10 = pol->TxPassiveStray;
    if (0 < iVar2) {
      iVar2 = 1;
      if (1 < iVar13 * 0x15) {
        iVar2 = iVar13 * 0x15;
      }
      do {
        cVar1 = *pcVar8;
        if (cVar1 < ' ') break;
        pcVar8 = pcVar8 + 1;
        *pcVar10 = cVar1;
        pcVar10 = pcVar10 + 1;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    *pcVar10 = '\0';
  }
  lVar4 = 0;
  do {
    if (pcVar8[lVar4] < ' ') {
      return;
    }
    pol->TxSystemStatus[lVar4] = pcVar8[lVar4];
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 != 4);
  return;
}

Assistant:

void ndiTXHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode = NDI_XFORMS_AND_STATUS; // the default reply mode
    char* writePointer;
    int i, j, n;
    int handle, handleCount, strayCount;

    // if the TX command had a reply mode, read it
    if ((command[2] == ':' && command[7] != '\r') || (command[2] == ' ' && command[3] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[3], 4);
    }

    // get the number of handles
    handleCount = (int)ndiHexToUnsignedLong(commandReply, 2);
    for (j = 0; j < 2 && *commandReply >= ' '; j++)
    {
      commandReply++;
    }

    // go through the information for each handle
    for (i = 0; i < handleCount; i++)
    {
      // get the handle itself (two chars)
      handle = (int)ndiHexToUnsignedLong(commandReply, 2);
      for (j = 0; j < 2 && *commandReply >= ' '; j++)
      {
        commandReply++;
      }

      // check for "UNOCCUPIED"
      if (*commandReply == 'U')
      {
        for (j = 0; j < 10 && *commandReply >= ' '; j++)
        {
          commandReply++;
        }
        // back up and continue (don't store information for unoccupied ports)
        i--;
        handleCount--;
        continue;
      }

      // save the port handle in the list
      pol->TxHandles[i] = handle;

      if (mode & NDI_XFORMS_AND_STATUS)
      {
        // get the transform, MISSING, or DISABLED
        writePointer = pol->TxTransforms[i];

        if (*commandReply == 'M')
        {
          // check for "MISSING"
          for (j = 0; j < 7 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        else if (*commandReply == 'D')
        {
          // check for "DISABLED"
          for (j = 0; j < 8 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        else
        {
          // read the transform
          for (j = 0; j < 51 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        *writePointer = '\0';

        // get the status
        writePointer = pol->TxStatus[i];
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }

        // get the frame number
        writePointer = pol->TxFrame[i];
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // grab additional information
      if (mode & NDI_ADDITIONAL_INFO)
      {
        writePointer = pol->TxInformation[i];
        for (j = 0; j < 20 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // grab the single marker info
      if (mode & NDI_SINGLE_STRAY)
      {
        writePointer = pol->TxSingleStray[i];
        if (*commandReply == 'M')
        {
          // check for "MISSING"
          for (j = 0; j < 7 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        else if (*commandReply == 'D')
        {
          // check for "DISABLED"
          for (j = 0; j < 8 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        else
        {
          // read the single stray position
          for (j = 0; j < 21 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        *writePointer = '\0';
      }

      // skip over any unsupported information
      while (*commandReply >= ' ')
      {
        commandReply++;
      }

      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    // save the number of handles (minus the unoccupied handles)
    pol->TxHandleCount = handleCount;

    // get all the passive stray information
    // this will be a maximum of 2 + ceil(numMarkers*0.5) + Y
    // where Y is
    //   0800 not used: 21 * numMarkers inside characterized measurement volume
    //   0800 used: 21 * numMarkers
    if (mode & NDI_PASSIVE_STRAY)
    {
      // get the number of strays
      strayCount = (int)ndiHexToUnsignedLong(commandReply, 2);
      for (j = 0; j < 2 && *commandReply >= ' '; j++)
      {
        commandReply++;
      }
      if (strayCount > 50)
      {
        strayCount = 50;
      }
      pol->TxPassiveStrayCount = strayCount;
      // get the out-of-volume bits
      writePointer = pol->TxPassiveStrayOov;
      n = (strayCount + 3) / 4;
      for (j = 0; j < n && *commandReply >= ' '; j++)
      {
        *writePointer++ = *commandReply++;
      }
      // get the coordinates
      writePointer = pol->TxPassiveStray;
      n = strayCount * 21;
      for (j = 0; j < n && *commandReply >= ' '; j++)
      {
        *writePointer++ = *commandReply++;
      }
      *writePointer = '\0';
    }

    // get the system status
    writePointer = pol->TxSystemStatus;
    for (j = 0; j < 4 && *commandReply >= ' '; j++)
    {
      *writePointer++ = *commandReply++;
    }
  }